

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_exhaustive.c
# Opt level: O0

void r_from_k(secp256k1_scalar *r,secp256k1_ge *group,int k,int *overflow)

{
  int in_EDX;
  long in_RSI;
  uchar x_bin [32];
  secp256k1_fe x;
  secp256k1_fe *in_stack_ffffffffffffff88;
  int *in_stack_ffffffffffffff90;
  uchar *in_stack_ffffffffffffff98;
  secp256k1_scalar *in_stack_ffffffffffffffa0;
  undefined1 local_50 [60];
  int local_14;
  
  local_14 = in_EDX % 0xd;
  memcpy(local_50,(void *)(in_RSI + (long)local_14 * 0x68),0x30);
  secp256k1_fe_normalize((secp256k1_fe *)0x127991);
  secp256k1_fe_get_b32((uchar *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  secp256k1_scalar_set_b32
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  return;
}

Assistant:

static void r_from_k(secp256k1_scalar *r, const secp256k1_ge *group, int k, int* overflow) {
    secp256k1_fe x;
    unsigned char x_bin[32];
    k %= EXHAUSTIVE_TEST_ORDER;
    x = group[k].x;
    secp256k1_fe_normalize(&x);
    secp256k1_fe_get_b32(x_bin, &x);
    secp256k1_scalar_set_b32(r, x_bin, overflow);
}